

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O0

void google::protobuf::json_internal::ParseProto3Type::SetBool(Field f,Msg *msg,bool x)

{
  Msg *this;
  int32_t iVar1;
  Field *this_00;
  undefined1 local_1a;
  byte local_19;
  char b;
  Msg *pMStack_18;
  bool x_local;
  Msg *msg_local;
  Field f_local;
  
  local_19 = x;
  pMStack_18 = msg;
  msg_local = (Msg *)f;
  RecordAsSeen(f,msg);
  this = pMStack_18;
  this_00 = ResolverPool::Field::proto((Field *)msg_local);
  iVar1 = Field::number(this_00);
  io::CodedOutputStream::WriteTag(&this->stream_,iVar1 << 3);
  local_1a = (local_19 & 1) != 0;
  io::CodedOutputStream::WriteRaw(&pMStack_18->stream_,&local_1a,1);
  return;
}

Assistant:

static void SetBool(Field f, Msg& msg, bool x) {
    RecordAsSeen(f, msg);
    msg.stream_.WriteTag(f->proto().number() << 3);
    char b = x ? 0x01 : 0x00;
    msg.stream_.WriteRaw(&b, 1);
  }